

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O0

QString * __thiscall QStorageInfo::displayName(QStorageInfo *this)

{
  bool bVar1;
  QString *in_RDI;
  QString *this_00;
  
  this_00 = in_RDI;
  QExplicitlySharedDataPointer<QStorageInfoPrivate>::operator->
            ((QExplicitlySharedDataPointer<QStorageInfoPrivate> *)0x2f478d);
  bVar1 = QString::isEmpty((QString *)0x2f4799);
  if (bVar1) {
    QExplicitlySharedDataPointer<QStorageInfoPrivate>::operator->
              ((QExplicitlySharedDataPointer<QStorageInfoPrivate> *)0x2f47c3);
    QString::QString(this_00,in_RDI);
  }
  else {
    QExplicitlySharedDataPointer<QStorageInfoPrivate>::operator->
              ((QExplicitlySharedDataPointer<QStorageInfoPrivate> *)0x2f47a7);
    QString::QString(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

QString QStorageInfo::displayName() const
{
    if (!d->name.isEmpty())
        return d->name;
    return d->rootPath;
}